

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown34_1_Box_SSSE3
               (uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  uvec8 auVar19;
  uvec8 auVar20;
  uvec8 auVar21;
  uvec8 auVar22;
  uvec8 auVar23;
  vec16 aiVar24;
  int iVar25;
  ushort uVar26;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar27 [16];
  ushort uVar36;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  aiVar24 = libyuv::kRound34;
  auVar23 = libyuv::kMadd11;
  auVar22 = libyuv::kMadd01;
  auVar21 = libyuv::kShuf21;
  auVar20 = libyuv::kShuf11;
  auVar19 = libyuv::kShuf01;
  do {
    puVar1 = src_ptr + src_stride;
    auVar27[0] = pavgb(*src_ptr,*puVar1);
    auVar27[1] = pavgb(src_ptr[1],puVar1[1]);
    auVar27[2] = pavgb(src_ptr[2],puVar1[2]);
    auVar27[3] = pavgb(src_ptr[3],puVar1[3]);
    auVar27[4] = pavgb(src_ptr[4],puVar1[4]);
    auVar27[5] = pavgb(src_ptr[5],puVar1[5]);
    auVar27[6] = pavgb(src_ptr[6],puVar1[6]);
    auVar27[7] = pavgb(src_ptr[7],puVar1[7]);
    auVar27[8] = pavgb(src_ptr[8],puVar1[8]);
    auVar27[9] = pavgb(src_ptr[9],puVar1[9]);
    auVar27[10] = pavgb(src_ptr[10],puVar1[10]);
    auVar27[0xb] = pavgb(src_ptr[0xb],puVar1[0xb]);
    auVar27[0xc] = pavgb(src_ptr[0xc],puVar1[0xc]);
    auVar27[0xd] = pavgb(src_ptr[0xd],puVar1[0xd]);
    auVar27[0xe] = pavgb(src_ptr[0xe],puVar1[0xe]);
    auVar27[0xf] = pavgb(src_ptr[0xf],puVar1[0xf]);
    auVar27 = pshufb(auVar27,(undefined1  [16])auVar19);
    auVar27 = pmaddubsw(auVar27,(undefined1  [16])auVar22);
    auVar27 = paddsw(auVar27,(undefined1  [16])aiVar24);
    uVar26 = auVar27._0_2_ >> 2;
    uVar30 = auVar27._2_2_ >> 2;
    uVar31 = auVar27._4_2_ >> 2;
    uVar32 = auVar27._6_2_ >> 2;
    uVar33 = auVar27._8_2_ >> 2;
    uVar34 = auVar27._10_2_ >> 2;
    uVar35 = auVar27._12_2_ >> 2;
    uVar36 = auVar27._14_2_ >> 2;
    *(ulong *)dst_ptr =
         CONCAT17((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                           CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 -
                                    (0xff < uVar34),
                                    CONCAT14((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 -
                                             (0xff < uVar33),
                                             CONCAT13((uVar32 != 0) * (uVar32 < 0x100) *
                                                      (char)uVar32 - (0xff < uVar32),
                                                      CONCAT12((uVar31 != 0) * (uVar31 < 0x100) *
                                                               (char)uVar31 - (0xff < uVar31),
                                                               CONCAT11((uVar30 != 0) *
                                                                        (uVar30 < 0x100) *
                                                                        (char)uVar30 -
                                                                        (0xff < uVar30),
                                                                        (uVar26 != 0) *
                                                                        (uVar26 < 0x100) *
                                                                        (char)uVar26 -
                                                                        (0xff < uVar26))))))));
    puVar1 = src_ptr + src_stride + 8;
    auVar28[0] = pavgb(src_ptr[8],*puVar1);
    auVar28[1] = pavgb(src_ptr[9],puVar1[1]);
    auVar28[2] = pavgb(src_ptr[10],puVar1[2]);
    auVar28[3] = pavgb(src_ptr[0xb],puVar1[3]);
    auVar28[4] = pavgb(src_ptr[0xc],puVar1[4]);
    auVar28[5] = pavgb(src_ptr[0xd],puVar1[5]);
    auVar28[6] = pavgb(src_ptr[0xe],puVar1[6]);
    auVar28[7] = pavgb(src_ptr[0xf],puVar1[7]);
    auVar28[8] = pavgb(src_ptr[0x10],puVar1[8]);
    auVar28[9] = pavgb(src_ptr[0x11],puVar1[9]);
    auVar28[10] = pavgb(src_ptr[0x12],puVar1[10]);
    auVar28[0xb] = pavgb(src_ptr[0x13],puVar1[0xb]);
    auVar28[0xc] = pavgb(src_ptr[0x14],puVar1[0xc]);
    auVar28[0xd] = pavgb(src_ptr[0x15],puVar1[0xd]);
    auVar28[0xe] = pavgb(src_ptr[0x16],puVar1[0xe]);
    auVar28[0xf] = pavgb(src_ptr[0x17],puVar1[0xf]);
    auVar27 = pshufb(auVar28,(undefined1  [16])auVar20);
    auVar27 = pmaddubsw(auVar27,(undefined1  [16])auVar23);
    auVar27 = paddsw(auVar27,(undefined1  [16])aiVar24);
    uVar26 = auVar27._0_2_ >> 2;
    uVar30 = auVar27._2_2_ >> 2;
    uVar31 = auVar27._4_2_ >> 2;
    uVar32 = auVar27._6_2_ >> 2;
    uVar33 = auVar27._8_2_ >> 2;
    uVar34 = auVar27._10_2_ >> 2;
    uVar35 = auVar27._12_2_ >> 2;
    uVar36 = auVar27._14_2_ >> 2;
    *(ulong *)(dst_ptr + 8) =
         CONCAT17((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                           CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 -
                                    (0xff < uVar34),
                                    CONCAT14((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 -
                                             (0xff < uVar33),
                                             CONCAT13((uVar32 != 0) * (uVar32 < 0x100) *
                                                      (char)uVar32 - (0xff < uVar32),
                                                      CONCAT12((uVar31 != 0) * (uVar31 < 0x100) *
                                                               (char)uVar31 - (0xff < uVar31),
                                                               CONCAT11((uVar30 != 0) *
                                                                        (uVar30 < 0x100) *
                                                                        (char)uVar30 -
                                                                        (0xff < uVar30),
                                                                        (uVar26 != 0) *
                                                                        (uVar26 < 0x100) *
                                                                        (char)uVar26 -
                                                                        (0xff < uVar26))))))));
    puVar1 = src_ptr + 0x10;
    puVar4 = src_ptr + 0x11;
    puVar5 = src_ptr + 0x12;
    puVar6 = src_ptr + 0x13;
    puVar7 = src_ptr + 0x14;
    puVar8 = src_ptr + 0x15;
    puVar9 = src_ptr + 0x16;
    puVar10 = src_ptr + 0x17;
    puVar11 = src_ptr + 0x18;
    puVar12 = src_ptr + 0x19;
    puVar13 = src_ptr + 0x1a;
    puVar14 = src_ptr + 0x1b;
    puVar15 = src_ptr + 0x1c;
    puVar16 = src_ptr + 0x1d;
    puVar17 = src_ptr + 0x1e;
    puVar18 = src_ptr + 0x1f;
    puVar2 = src_ptr + src_stride + 0x10;
    src_ptr = src_ptr + 0x20;
    auVar29[0] = pavgb(*puVar1,*puVar2);
    auVar29[1] = pavgb(*puVar4,puVar2[1]);
    auVar29[2] = pavgb(*puVar5,puVar2[2]);
    auVar29[3] = pavgb(*puVar6,puVar2[3]);
    auVar29[4] = pavgb(*puVar7,puVar2[4]);
    auVar29[5] = pavgb(*puVar8,puVar2[5]);
    auVar29[6] = pavgb(*puVar9,puVar2[6]);
    auVar29[7] = pavgb(*puVar10,puVar2[7]);
    auVar29[8] = pavgb(*puVar11,puVar2[8]);
    auVar29[9] = pavgb(*puVar12,puVar2[9]);
    auVar29[10] = pavgb(*puVar13,puVar2[10]);
    auVar29[0xb] = pavgb(*puVar14,puVar2[0xb]);
    auVar29[0xc] = pavgb(*puVar15,puVar2[0xc]);
    auVar29[0xd] = pavgb(*puVar16,puVar2[0xd]);
    auVar29[0xe] = pavgb(*puVar17,puVar2[0xe]);
    auVar29[0xf] = pavgb(*puVar18,puVar2[0xf]);
    auVar27 = pshufb(auVar29,(undefined1  [16])auVar21);
    auVar27 = pmaddubsw(auVar27,(undefined1  [16])libyuv::kMadd21);
    auVar27 = paddsw(auVar27,(undefined1  [16])aiVar24);
    uVar26 = auVar27._0_2_ >> 2;
    uVar30 = auVar27._2_2_ >> 2;
    uVar31 = auVar27._4_2_ >> 2;
    uVar32 = auVar27._6_2_ >> 2;
    uVar33 = auVar27._8_2_ >> 2;
    uVar34 = auVar27._10_2_ >> 2;
    uVar35 = auVar27._12_2_ >> 2;
    uVar36 = auVar27._14_2_ >> 2;
    *(ulong *)(dst_ptr + 0x10) =
         CONCAT17((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                           CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 -
                                    (0xff < uVar34),
                                    CONCAT14((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 -
                                             (0xff < uVar33),
                                             CONCAT13((uVar32 != 0) * (uVar32 < 0x100) *
                                                      (char)uVar32 - (0xff < uVar32),
                                                      CONCAT12((uVar31 != 0) * (uVar31 < 0x100) *
                                                               (char)uVar31 - (0xff < uVar31),
                                                               CONCAT11((uVar30 != 0) *
                                                                        (uVar30 < 0x100) *
                                                                        (char)uVar30 -
                                                                        (0xff < uVar30),
                                                                        (uVar26 != 0) *
                                                                        (uVar26 < 0x100) *
                                                                        (char)uVar26 -
                                                                        (0xff < uVar26))))))));
    dst_ptr = dst_ptr + 0x18;
    iVar25 = dst_width + -0x18;
    bVar3 = 0x17 < dst_width;
    dst_width = iVar25;
  } while (iVar25 != 0 && bVar3);
  return;
}

Assistant:

void ScaleRowDown34_1_Box_SSSE3(const uint8_t* src_ptr,
                                ptrdiff_t src_stride,
                                uint8_t* dst_ptr,
                                int dst_width) {
  asm volatile(
      "movdqa      %0,%%xmm2                     \n"  // kShuf01
      "movdqa      %1,%%xmm3                     \n"  // kShuf11
      "movdqa      %2,%%xmm4                     \n"  // kShuf21
      :
      : "m"(kShuf01),  // %0
        "m"(kShuf11),  // %1
        "m"(kShuf21)   // %2
  );
  asm volatile(
      "movdqa      %0,%%xmm5                     \n"  // kMadd01
      "movdqa      %1,%%xmm0                     \n"  // kMadd11
      "movdqa      %2,%%xmm1                     \n"  // kRound34
      :
      : "m"(kMadd01),  // %0
        "m"(kMadd11),  // %1
        "m"(kRound34)  // %2
  );
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm6                   \n"
      "movdqu      0x00(%0,%3,1),%%xmm7          \n"
      "pavgb       %%xmm7,%%xmm6                 \n"
      "pshufb      %%xmm2,%%xmm6                 \n"
      "pmaddubsw   %%xmm5,%%xmm6                 \n"
      "paddsw      %%xmm1,%%xmm6                 \n"
      "psrlw       $0x2,%%xmm6                   \n"
      "packuswb    %%xmm6,%%xmm6                 \n"
      "movq        %%xmm6,(%1)                   \n"
      "movdqu      0x8(%0),%%xmm6                \n"
      "movdqu      0x8(%0,%3,1),%%xmm7           \n"
      "pavgb       %%xmm7,%%xmm6                 \n"
      "pshufb      %%xmm3,%%xmm6                 \n"
      "pmaddubsw   %%xmm0,%%xmm6                 \n"
      "paddsw      %%xmm1,%%xmm6                 \n"
      "psrlw       $0x2,%%xmm6                   \n"
      "packuswb    %%xmm6,%%xmm6                 \n"
      "movq        %%xmm6,0x8(%1)                \n"
      "movdqu      0x10(%0),%%xmm6               \n"
      "movdqu      0x10(%0,%3,1),%%xmm7          \n"
      "lea         0x20(%0),%0                   \n"
      "pavgb       %%xmm7,%%xmm6                 \n"
      "pshufb      %%xmm4,%%xmm6                 \n"
      "pmaddubsw   %4,%%xmm6                     \n"
      "paddsw      %%xmm1,%%xmm6                 \n"
      "psrlw       $0x2,%%xmm6                   \n"
      "packuswb    %%xmm6,%%xmm6                 \n"
      "movq        %%xmm6,0x10(%1)               \n"
      "lea         0x18(%1),%1                   \n"
      "sub         $0x18,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),                // %0
        "+r"(dst_ptr),                // %1
        "+r"(dst_width)               // %2
      : "r"((intptr_t)(src_stride)),  // %3
        "m"(kMadd21)                  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}